

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O3

int __thiscall
SPP::solveSPV(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  float fVar1;
  double dVar2;
  double dVar3;
  Satellite *pSVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  XYZ a;
  XYZ a_00;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  int i;
  uint row;
  void *__src;
  Matrix<double,__1,__1> *this_00;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  MatrixXd B;
  MatrixXd w;
  MatrixXd P;
  XYZ RefV;
  MatrixXd v;
  int flag;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp2;
  MatrixXd tmp1;
  MatrixXd B_T;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  Matrix<double,__1,__1> local_228;
  undefined1 local_218 [16];
  SPP *local_208;
  int local_1fc;
  Matrix<double,__1,__1> local_1f8;
  Matrix<double,__1,__1> local_1e8;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b0;
  double local_1a8;
  XYZ *local_1a0;
  double local_198;
  XYZ local_190;
  Matrix<double,__1,__1> local_178;
  double local_168;
  double dStack_160;
  int local_14c;
  Matrix<double,_3,_1> local_148;
  Matrix<double,__1,__1> local_138;
  Matrix<double,__1,__1> local_128;
  Matrix<double,__1,__1> local_118;
  Matrix<double,__1,__1> local_108;
  Matrix<double,__1,__1> local_f8;
  Matrix<double,__1,__1> local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  undefined8 uStack_90;
  Matrix<double,__1,__1> local_80;
  Matrix<double,__1,__1> local_70;
  Matrix<double,__1,__1> local_60;
  Matrix<double,__1,__1> local_50;
  Matrix<double,__1,__1> local_40;
  
  pdVar11 = &(*GPSPosAndVel)->n;
  iVar15 = 0;
  lVar12 = 0x40;
  do {
    if (((*pdVar11 != -1.0) || (NAN(*pdVar11))) &&
       ((fVar1 = *(float *)((long)(*GPSObs)->psr + lVar12 + -0x10), fVar1 != -1.0 || (NAN(fVar1)))))
    {
      iVar15 = iVar15 + 1;
    }
    pdVar11 = pdVar11 + 0x17;
    lVar12 = lVar12 + 0x70;
  } while (lVar12 != 0xe40);
  pdVar11 = &(*BDSPosAndVel)->n;
  iVar14 = 0;
  lVar12 = 0x40;
  do {
    if (((*pdVar11 != -1.0) || (NAN(*pdVar11))) &&
       ((fVar1 = *(float *)((long)(*BDSObs)->psr + lVar12 + -0x10), fVar1 != -1.0 || (NAN(fVar1)))))
    {
      iVar14 = iVar14 + 1;
    }
    pdVar11 = pdVar11 + 0x17;
    lVar12 = lVar12 + 0x70;
  } while (lVar12 != 0x1c40);
  local_198 = (this->result).UserPositionXYZ.Z;
  iVar9 = 1;
  if ((local_198 != -1.0) || (NAN(local_198))) {
    local_1a0 = &(this->result).UserPositionXYZ;
    local_1a8 = (this->result).UserPositionXYZ.X;
    local_1b0 = (this->result).UserPositionXYZ.Y;
    local_1fc = iVar14 + iVar15;
    Matrix<double,_-1,_-1>::Matrix(&local_228,local_1fc,4);
    Matrix<double,_-1,_-1>::Matrix(&local_1e8,local_228.rows,local_228.rows);
    Matrix<double,_-1,_-1>::Matrix(&local_1f8,local_228.rows,1);
    XYZ::XYZ(&local_190,0.0,0.0,0.0);
    Matrix<double,_-1,_-1>::Zero(&local_228);
    Matrix<double,_-1,_-1>::Zero(&local_1e8);
    local_208 = this;
    if (iVar15 == 0) {
      iVar15 = 0;
    }
    else {
      pdVar11 = (double *)&(this->result).field_0x680;
      lVar13 = 0;
      uVar16 = 0xffffffffffffffff;
      lVar12 = 0x40;
      iVar15 = 0;
      do {
        pSVar4 = *GPSPosAndVel;
        dVar2 = *(double *)((long)&pSVar4->n + lVar13);
        if (((dVar2 != -1.0) || (NAN(dVar2))) &&
           ((fVar1 = *(float *)((long)(*GPSObs)->psr + lVar12 + -0x10), fVar1 != -1.0 ||
            (NAN(fVar1))))) {
          dVar2 = *(double *)((long)&(pSVar4->SatVelocity).X + lVar13);
          local_1c8 = *(double *)((long)&(pSVar4->SatVelocity).Y + lVar13);
          local_218._0_8_ = *(undefined8 *)((long)&(pSVar4->SatVelocity).Z + lVar13);
          local_1d8 = *pdVar11;
          local_168 = *(double *)*(undefined1 (*) [16])(pdVar11 + -2);
          dStack_160 = pdVar11[-1];
          a.Z = local_1d8;
          a._0_16_ = *(undefined1 (*) [16])(pdVar11 + -2);
          local_b8 = local_168;
          dStack_b0 = dStack_160;
          local_a8 = local_1d8;
          dVar5 = dist(a,*local_1a0);
          local_98 = (local_1a8 - local_168) / dVar5;
          uStack_90 = 0;
          local_168 = (local_1b0 - dStack_160) / dVar5;
          local_1d8 = (local_198 - local_1d8) / dVar5;
          local_218._8_4_ = DAT_00111210._8_4_;
          local_218._0_8_ =
               ((double)((ulong)local_98 ^ (ulong)DAT_00111210) * dVar2 - local_1c8 * local_168) -
               (double)local_218._0_8_ * local_1d8;
          local_218._12_4_ = DAT_00111210._12_4_;
          dVar2 = *(double *)((long)&(*GPSPosAndVel)->clkdot + lVar13);
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,0);
          *pdVar10 = local_98;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,1);
          *pdVar10 = local_168;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,2);
          *pdVar10 = local_1d8;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,3);
          *pdVar10 = 1.0;
          local_218._0_8_ =
               (((double)*(float *)((long)(*GPSObs)->psr + lVar12 + -0x10) * 299792458.0) /
                -1575420000.0 - (double)local_218._0_8_) + dVar2 * 299792458.0;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_1f8,iVar15,0);
          *pdVar10 = (double)local_218._0_8_;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar15,iVar15);
          *pdVar10 = 1.0;
          iVar15 = iVar15 + 1;
        }
        uVar16 = uVar16 + 1;
        pdVar11 = pdVar11 + 3;
        lVar13 = lVar13 + 0xb8;
        lVar12 = lVar12 + 0x70;
      } while (uVar16 < 0x1f);
    }
    if (iVar14 != 0) {
      pdVar11 = (double *)&(local_208->result).field_0x80;
      uVar16 = 0xffffffffffffffff;
      lVar13 = 0x40;
      lVar12 = 0;
      do {
        pSVar4 = *BDSPosAndVel;
        dVar2 = *(double *)((long)&pSVar4->n + lVar12);
        if (((dVar2 != -1.0) || (NAN(dVar2))) &&
           ((fVar1 = *(float *)((long)(*BDSObs)->psr + lVar13 + -0x10), fVar1 != -1.0 ||
            (NAN(fVar1))))) {
          dVar2 = *(double *)((long)&(pSVar4->SatVelocity).X + lVar12);
          local_218._0_8_ = *(undefined8 *)((long)&(pSVar4->SatVelocity).Y + lVar12);
          dVar5 = *(double *)((long)&(pSVar4->SatVelocity).Z + lVar12);
          dVar3 = *pdVar11;
          local_1c8 = *(double *)*(undefined1 (*) [16])(pdVar11 + -2);
          dStack_1c0 = pdVar11[-1];
          a_00.Z = dVar3;
          a_00._0_16_ = *(undefined1 (*) [16])(pdVar11 + -2);
          local_d8 = local_1c8;
          dStack_d0 = dStack_1c0;
          local_c8 = dVar3;
          dVar6 = dist(a_00,*local_1a0);
          local_1d8 = (local_1a8 - local_1c8) / dVar6;
          uStack_1d0 = 0;
          local_1c8 = (local_1b0 - dStack_1c0) / dVar6;
          dVar6 = (local_198 - dVar3) / dVar6;
          dVar7 = (double)((ulong)local_1d8 ^ (ulong)DAT_00111210);
          dVar8 = (double)local_218._0_8_ * local_1c8;
          dVar3 = *(double *)((long)&(*BDSPosAndVel)->clkdot + lVar12);
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,0);
          *pdVar10 = local_1d8;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,1);
          *pdVar10 = local_1c8;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,2);
          *pdVar10 = dVar6;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_228,iVar15,3);
          *pdVar10 = 1.0;
          fVar1 = *(float *)((long)(*BDSObs)->psr + lVar13 + -0x10);
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_1f8,iVar15,0);
          *pdVar10 = (((double)fVar1 * 299792458.0) / -1561098000.0 -
                     ((dVar7 * dVar2 - dVar8) - dVar5 * dVar6)) + dVar3 * 299792458.0;
          pdVar10 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar15,iVar15);
          *pdVar10 = 1.0;
          iVar15 = iVar15 + 1;
        }
        uVar16 = uVar16 + 1;
        pdVar11 = pdVar11 + 3;
        lVar12 = lVar12 + 0xb8;
        lVar13 = lVar13 + 0x70;
      } while (uVar16 < 0x3f);
    }
    local_14c = 0;
    local_e8 = Matrix<double,_-1,_-1>::transpose(&local_228);
    local_f8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_e8,&local_1e8);
    local_108 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_f8,&local_228);
    local_118 = Matrix<double,_-1,_-1>::inverse(&local_108,&local_14c);
    local_128 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_118,&local_e8);
    local_138 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_128,&local_1e8);
    local_178 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_138,&local_1f8);
    pdVar11 = local_178.data;
    if (local_14c == 0) {
      pdVar11 = Matrix<double,_-1,_-1>::operator()(&local_178,0,0);
      local_190.X = *pdVar11 + local_190.X;
      pdVar11 = Matrix<double,_-1,_-1>::operator()(&local_178,1,0);
      local_190.Y = *pdVar11 + local_190.Y;
      pdVar11 = Matrix<double,_-1,_-1>::operator()(&local_178,2,0);
      local_190.Z = *pdVar11 + local_190.Z;
      Matrix<double,_-1,_-1>::operator()(&local_178,3,0);
      local_40 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_228,&local_178);
      local_50 = Matrix<double,_-1,_-1>::operator-(&local_40,&local_1f8);
      local_60 = Matrix<double,_-1,_-1>::transpose(&local_50);
      local_70 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_60,&local_1e8);
      local_80 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_70,&local_50);
      pdVar11 = Matrix<double,_-1,_-1>::operator()(&local_80,0,0);
      dVar2 = *pdVar11 / (double)(local_1fc + -4);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      (local_208->result).UserVelocitySigma = dVar2;
      if (local_40.data != (double *)0x0) {
        operator_delete__(local_40.data);
      }
      if (local_50.data != (double *)0x0) {
        operator_delete__(local_50.data);
      }
      if (local_60.data != (double *)0x0) {
        operator_delete__(local_60.data);
      }
      if (local_70.data != (double *)0x0) {
        operator_delete__(local_70.data);
      }
      if (local_80.data != (double *)0x0) {
        operator_delete__(local_80.data);
      }
      local_148.rows = 3;
      local_148.cols = 1;
      local_148.data = (double *)operator_new__(0x18);
      row = 0;
      do {
        pdVar11 = Matrix<double,_-1,_-1>::operator()(&local_178,row,0);
        dVar2 = *pdVar11;
        __src = (void *)(ulong)row;
        pdVar11 = Matrix<double,_3,_1>::operator()(&local_148,row,0);
        *pdVar11 = dVar2;
        row = row + 1;
      } while ((int)row < local_148.rows);
      Matrix<double,_3,_1>::deleteMatrix(&local_148);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_e8);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_f8);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_108);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_118);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_128);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_138);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_178);
      (local_208->result).UserVelocity.Z = local_190.Z;
      (local_208->result).UserVelocity.X = local_190.X;
      (local_208->result).UserVelocity.Y = local_190.Y;
      Matrix<double,_-1,_-1>::deleteMatrix(&local_228);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_1e8);
      this_00 = &local_1f8;
      Matrix<double,_-1,_-1>::deleteMatrix(this_00);
      memcpy(this_00,__src,0x12b8);
      return (int)this_00;
    }
    if (local_e8.data != (double *)0x0) {
      operator_delete__(local_e8.data);
    }
    if (local_f8.data != (double *)0x0) {
      operator_delete__(local_f8.data);
    }
    if (local_108.data != (double *)0x0) {
      operator_delete__(local_108.data);
    }
    if (local_118.data != (double *)0x0) {
      operator_delete__(local_118.data);
    }
    if (local_128.data != (double *)0x0) {
      operator_delete__(local_128.data);
    }
    if (local_138.data != (double *)0x0) {
      operator_delete__(local_138.data);
    }
    if (local_1e8.data != (double *)0x0) {
      operator_delete__(local_1e8.data);
    }
    if (local_1f8.data != (double *)0x0) {
      operator_delete__(local_1f8.data);
    }
    if (local_228.data != (double *)0x0) {
      operator_delete__(local_228.data);
    }
    if (pdVar11 != (double *)0x0) {
      operator_delete__(pdVar11);
    }
    iVar9 = 5;
  }
  return iVar9;
}

Assistant:

int SPP::solveSPV(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
             Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
             Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 4;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1 && GPSObs[i].dopp[0] != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1 && BDSObs[i].dopp[0] != -1)
            BDSObsNum ++;
    // BDSObsNum = 0;
    XYZ RefPos = this->result.UserPositionXYZ;
    if(RefPos.Z == -1)
        return 1;
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    XYZ RefV(0, 0, 0);
    B.Zero();
    P.Zero();
    int count = 0;
    // cout << GPSObsNum << endl;
    double R = 0;
    int num = 0;
    for(int prn = 0; prn < MAXGPSSRN; ++prn)
    {
        if(GPSObsNum == 0)
            break;
        if(GPSPosAndVel[prn].n == -1 ||
            GPSObs[prn].dopp[0] == -1)
            continue;

        XYZ fix = GPSPosAndVel[prn].SatVelocity;
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.GPSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.GPSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = GPSPosAndVel[prn].clkdot;//GPSEph[prn].af1 + 2 * GPSEph[prn].af2 *
                            //(GPSPosAndVel[prn].t - GPSPosAndVel[prn].deltat - GPSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -GPSObs[prn].dopp[0] * LIGHTSPEED / GPSL1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn)
    {
        if(BDSObsNum == 0)
            break;
        if(BDSPosAndVel[prn].n == -1 ||
            BDSObs[prn].dopp[0] == -1)
            continue;
        // 地球自转改正
        XYZ fix = BDSPosAndVel[prn].SatVelocity;
        // EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatVelocity, BDS, fix);
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.BDSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.BDSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = BDSPosAndVel[prn].clkdot;//BDSEph[prn].af1 + 2 * BDSEph[prn].af2 *
                            //(BDSPosAndVel[prn].t - BDSPosAndVel[prn].deltat - BDSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -BDSObs[prn].dopp[0] * LIGHTSPEED / BDSB1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    int flag = 0;
    MatrixXd B_T = B.transpose();
    MatrixXd tmp1 = B_T * P;
    MatrixXd tmp2 = tmp1 * B;
    MatrixXd tmp3 = tmp2.inverse(flag);
    MatrixXd tmp4 = tmp3 * B_T;
    MatrixXd tmp5 = tmp4 * P;
    MatrixXd v = tmp5 * w;

    if(flag != 0){
        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        P.deleteMatrix();
        w.deleteMatrix();
        B.deleteMatrix();
        v.deleteMatrix();
        return NOT_INVERTIBLE;
    }
    
    RefV.X += v(0, 0);
    RefV.Y += v(1, 0);
    RefV.Z += v(2, 0);
    R += v(3, 0);
    
    MatrixXd tmp6 = B * v;
    MatrixXd tmp7 = tmp6 - w;
    MatrixXd tmp8 = tmp7.transpose();
    MatrixXd tmp9 = tmp8 * P;
    MatrixXd tmp10 = tmp9 * tmp7;
    int Obsnum = 4;
    double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
    result.UserVelocitySigma = sigma;

    tmp6.deleteMatrix();
    tmp7.deleteMatrix();
    tmp8.deleteMatrix();
    tmp9.deleteMatrix();
    tmp10.deleteMatrix();

    Vector3d dx;
    for(int i = 0; i < dx.row(); i++)
        dx(i, 0) = v(i, 0);
    dx.deleteMatrix();
    B_T.deleteMatrix();
    tmp1.deleteMatrix();
    tmp2.deleteMatrix();
    tmp3.deleteMatrix();
    tmp4.deleteMatrix();
    tmp5.deleteMatrix();
    v.deleteMatrix();
    this->result.UserVelocity = RefV;
    B.deleteMatrix();
    P.deleteMatrix();
    w.deleteMatrix();
}